

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O0

CEObserver * __thiscall CEExecOptions::GenObserver(CEExecOptions *this)

{
  CEObserver *in_RDI;
  CEObserver *obs;
  string *in_stack_fffffffffffffe40;
  CLOptions *in_stack_fffffffffffffe48;
  CLOptions *this_00;
  undefined1 local_141 [33];
  double local_120;
  allocator local_111;
  string local_110 [32];
  double local_f0;
  allocator local_e1;
  string local_e0 [32];
  double local_c0;
  CEAngleType local_b8;
  allocator local_b1;
  string local_b0 [32];
  double local_90;
  allocator local_81;
  string local_80 [32];
  double local_60 [3];
  allocator local_41;
  string local_40 [32];
  double local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"longitude",&local_41);
  local_20 = CLOptions::AsDouble(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"latitude",&local_81);
  local_60[0] = CLOptions::AsDouble(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"elevation",&local_b1);
  local_90 = CLOptions::AsDouble(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  local_b8 = DEGREES;
  CEObserver::CEObserver(in_RDI,&local_20,local_60,&local_90,&local_b8);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"humidity",&local_e1);
  local_c0 = CLOptions::AsDouble(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  CEObserver::SetRelativeHumidity(in_RDI,&local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"pressure",&local_111);
  local_f0 = CLOptions::AsDouble(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  CEObserver::SetPressure_hPa(in_RDI,&local_f0);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  this_00 = (CLOptions *)local_141;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_141 + 1),"wavelength",(allocator *)this_00);
  local_120 = CLOptions::AsDouble(this_00,in_stack_fffffffffffffe40);
  CEObserver::SetWavelength_um(in_RDI,&local_120);
  std::__cxx11::string::~string((string *)(local_141 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_141);
  return in_RDI;
}

Assistant:

inline
CEObserver CEExecOptions::GenObserver(void)
{
    CEObserver obs(AsDouble("longitude"),
                   AsDouble("latitude"),
                   AsDouble("elevation"),
                   CEAngleType::DEGREES);
    obs.SetRelativeHumidity(AsDouble("humidity"));
    obs.SetPressure_hPa(AsDouble("pressure"));
    obs.SetWavelength_um(AsDouble("wavelength"));

    return obs;
}